

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::thirdparty_messages(DebugMessageTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Messages with source of GL_DEBUG_SOURCE_THIRD_PARTY",&local_31);
  NegativeTestShared::NegativeTestContext::beginSection(&ctx->super_NegativeTestContext,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  emitMessages(ctx,0x8249);
  NegativeTestShared::NegativeTestContext::endSection(&ctx->super_NegativeTestContext);
  return;
}

Assistant:

void thirdparty_messages (DebugMessageTestContext& ctx)
{
	ctx.beginSection("Messages with source of GL_DEBUG_SOURCE_THIRD_PARTY");
	emitMessages(ctx, GL_DEBUG_SOURCE_THIRD_PARTY);
	ctx.endSection();
}